

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ToInt32Free(JSContext *ctx,int32_t *pres,JSValue val)

{
  int32_t iVar1;
  JSValueUnion JVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  do {
    JVar2 = val.u;
    if ((uint)val.tag < 4) {
LAB_0011da2b:
      iVar5 = 0;
      iVar1 = JVar2.int32;
      goto LAB_0011da2d;
    }
    if ((uint)val.tag == 7) {
      uVar3 = val.u._4_4_ >> 0x14 & 0x7ff;
      if (uVar3 < 0x41e) {
        JVar2._0_4_ = (uint)JVar2.float64;
        JVar2._4_4_ = 0;
        goto LAB_0011da2b;
      }
      iVar5 = 0;
      iVar4 = 0;
      if (uVar3 < 0x453) {
        iVar4 = (int)((((ulong)JVar2.ptr & 0xfffffffffffff) + 0x10000000000000 <<
                      ((char)uVar3 - 0x13U & 0x3f)) >> 0x20);
        iVar1 = -iVar4;
        if (-1 < (long)JVar2.ptr) {
          iVar1 = iVar4;
        }
        goto LAB_0011da2d;
      }
      goto LAB_0011da09;
    }
    val = JS_ToNumberFree(ctx,val);
    iVar4 = -1;
    if ((int)val.tag == 6) {
LAB_0011da09:
      iVar5 = iVar4;
      iVar1 = 0;
LAB_0011da2d:
      *pres = iVar1;
      return iVar5;
    }
  } while( true );
}

Assistant:

static int JS_ToInt32Free(JSContext *ctx, int32_t *pres, JSValue val)
{
    uint32_t tag;
    int32_t ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        ret = JS_VALUE_GET_INT(val);
        break;
    case JS_TAG_FLOAT64:
        {
            JSFloat64Union u;
            double d;
            int e;
            d = JS_VALUE_GET_FLOAT64(val);
            u.d = d;
            /* we avoid doing fmod(x, 2^32) */
            e = (u.u64 >> 52) & 0x7ff;
            if (likely(e <= (1023 + 30))) {
                /* fast case */
                ret = (int32_t)d;
            } else if (e <= (1023 + 30 + 53)) {
                uint64_t v;
                /* remainder modulo 2^32 */
                v = (u.u64 & (((uint64_t)1 << 52) - 1)) | ((uint64_t)1 << 52);
                v = v << ((e - 1023) - 52 + 32);
                ret = v >> 32;
                /* take the sign into account */
                if (u.u64 >> 63)
                    ret = -ret;
            } else {
                ret = 0; /* also handles NaN and +inf */
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_get_int32(&ret, &p->num, BF_GET_INT_MOD);
            JS_FreeValue(ctx, val);
        }
        break;
#endif
    default:
        val = JS_ToNumberFree(ctx, val);
        if (JS_IsException(val)) {
            *pres = 0;
            return -1;
        }
        goto redo;
    }
    *pres = ret;
    return 0;
}